

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx2.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86_avx2::create_pipeline(LSTM_x86_avx2 *this,Option *opt)

{
  if (opt->use_weight_fp16_storage == true) {
    cast_float32_to_float16
              ((Mat *)(&this->field_0x128 + (long)this->_vptr_LSTM_x86_avx2[-3]),
               &this->weight_xc_data_fp16,opt);
    cast_float32_to_float16
              ((Mat *)(&this->field_0xe0 + (long)this->_vptr_LSTM_x86_avx2[-3]),
               &this->weight_hc_data_fp16,opt);
  }
  return 0;
}

Assistant:

int LSTM_x86_avx2::create_pipeline(const Option& opt)
{
#if __AVX2__
    if (opt.use_weight_fp16_storage)
    {
        ncnn::cast_float32_to_float16(weight_xc_data, weight_xc_data_fp16, opt);
        ncnn::cast_float32_to_float16(weight_hc_data, weight_hc_data_fp16, opt);
    }
#else
    (void)(opt);
#endif // __AVX__

    return 0;
}